

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O0

void __thiscall SaveButton::SaveButton(SaveButton *this)

{
  undefined8 *in_RDI;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,(char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  ToggleButton::ToggleButton((ToggleButton *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  *in_RDI = &PTR__SaveButton_001165d8;
  return;
}

Assistant:

SaveButton() : ToggleButton("Save raw") {}